

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::ManagedBuffer
          (ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this,
          ManagedBufferRegistry *registry_,string *name_,
          vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
          *data_,function<void_()> *computeFunc_)

{
  pointer pcVar1;
  uint64_t uVar2;
  
  WeakReferrable::WeakReferrable((WeakReferrable *)&this->field_0xc8);
  this->_vptr_ManagedBuffer = (_func_int **)0x5f3278;
  *(undefined8 *)&this->field_0xc8 = 0x5f32a0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name_->_M_string_length);
  uVar2 = internal::getNextUniqueID();
  this->uniqueID = uVar2;
  this->registry = registry_;
  this->data = data_;
  this->dataGetsComputed = true;
  std::function<void_()>::function(&this->computeFunc,computeFunc_);
  this->hostBufferIsPopulated = false;
  (this->renderAttributeBuffer).
  super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->renderAttributeBuffer).
  super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->renderTextureBuffer).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->renderTextureBuffer).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->deviceBufferType = Attribute;
  this->sizeX = 0;
  this->sizeY = 0;
  this->sizeZ = 0;
  (this->existingIndexedViews).
  super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->existingIndexedViews).
  super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->renderTextureBuffer).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->deviceBufferType = Attribute;
  this->sizeX = 0;
  this->sizeY = 0;
  this->sizeZ = 0;
  (this->existingIndexedViews).
  super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->existingIndexedViews).
  super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->existingIndexedViews).
  super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bufferIndexCopyProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->bufferIndexCopyProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this->registry != (ManagedBufferRegistry *)0x0) {
    ManagedBufferMap<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::addManagedBuffer
              (&this->registry->managedBufferMap_uvec3,this);
  }
  return;
}

Assistant:

ManagedBuffer<T>::ManagedBuffer(ManagedBufferRegistry* registry_, const std::string& name_, std::vector<T>& data_,
                                std::function<void()> computeFunc_)
    : name(name_), uniqueID(internal::getNextUniqueID()), registry(registry_), data(data_), dataGetsComputed(true),
      computeFunc(computeFunc_), hostBufferIsPopulated(false) {

  if (registry) {
    registry->addManagedBuffer<T>(this);
  }
}